

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

command_node * __thiscall
libchars::command_node::add(command_node *this,string *word,filter_t mask_,bool hidden_)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  size_type sVar4;
  double dVar5;
  bool bVar6;
  undefined4 uVar7;
  debug *pdVar8;
  command_node *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  command_node *pcVar11;
  undefined8 uVar12;
  undefined7 in_register_00000009;
  command *pcVar13;
  filter_t fVar14;
  ulong uVar15;
  command_node *pcVar16;
  command *parent;
  filter_t fVar17;
  ulong uVar18;
  filter_t fVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 local_b0 [32];
  filter_t local_90;
  filter_t local_88;
  command *local_80;
  command *local_78;
  command *local_70;
  command_node *local_68;
  command_node *local_60;
  undefined1 local_58 [8];
  string part;
  
  pdVar8 = debug::initialize(0);
  debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  this->mask = this->mask | mask_;
  if ((command *)this->head == (command *)0x0) {
    pcVar11 = (command_node *)debug::initialize(0);
    debug::log((debug *)pcVar11,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    pcVar11 = add_node(pcVar11,this,word,mask_,hidden_);
    return pcVar11;
  }
  local_80 = (command *)0x0;
  uVar15 = 0;
  fVar14 = 0;
  parent = (command *)this->head;
  fVar17 = 0;
  local_70 = (command *)this;
  local_68 = (command_node *)mask_;
  local_60 = (command_node *)word;
  part.field_2._12_4_ = (int)CONCAT71(in_register_00000009,hidden_);
  do {
    pcVar13 = local_70;
    local_88 = fVar17;
    if ((parent == (command *)0x0) ||
       (pcVar13 = parent, (((command_node *)word)->part)._M_string_length <= uVar15)) {
      local_90 = fVar14;
      pdVar8 = debug::initialize(0);
      pcVar9 = local_60;
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      pdVar8 = debug::initialize(0);
      fVar14 = local_88;
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      pcVar11 = local_68;
      if (uVar15 < (pcVar9->part)._M_string_length) {
        *(ulong *)&pcVar13->ID = *(ulong *)&pcVar13->ID | (ulong)local_68;
        pcVar16 = (command_node *)local_58;
        std::__cxx11::string::substr((ulong)local_58,(ulong)pcVar9);
        local_78 = (command *)
                   add_node(pcVar16,(command_node *)pcVar13,(string *)local_58,(filter_t)pcVar11,
                            (bool)part.field_2._M_local_buf[0xc]);
      }
      else {
        sVar4 = (pcVar13->name)._M_string_length;
        pdVar8 = debug::initialize(0);
        local_78 = pcVar13;
        if (sVar4 + fVar14 <= uVar15) {
          debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          *(ulong *)&pcVar13->ID = *(ulong *)&pcVar13->ID | (ulong)local_68;
          return (command_node *)local_78;
        }
        dVar5 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
        local_58 = (undefined1  [8])&part._M_string_length;
        pcVar3 = (pcVar13->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  (SUB84(dVar5,0),local_58,pcVar3,pcVar3 + (pcVar13->name)._M_string_length);
        std::__cxx11::string::assign((string *)pcVar13,(ulong)local_58,0);
        pcVar9 = (command_node *)(pcVar13->cmd_str).field_2._M_allocated_capacity;
        pcVar16 = *(command_node **)((long)&(pcVar13->cmd_str).field_2 + 8);
        (pcVar13->cmd_str).field_2._M_allocated_capacity = 0;
        *(command_node **)((long)&(pcVar13->cmd_str).field_2 + 8) = (command_node *)0x0;
        pcVar11 = (command_node *)local_b0;
        std::__cxx11::string::substr((ulong)pcVar11,(ulong)local_58);
        pcVar11 = add_node(pcVar11,(command_node *)pcVar13,(string *)local_b0,
                           *(filter_t *)&pcVar13->ID,*(bool *)&(pcVar13->cmd_str)._M_dataplus._M_p);
        uVar7 = part.field_2._12_4_;
        if ((command_node *)local_b0._0_8_ != (command_node *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        pcVar11->cmd = (command *)(local_78->cmd_str)._M_string_length;
        pcVar11->head = pcVar9;
        pcVar11->tail = pcVar16;
        pcVar11->start = (command_node *)(local_78->help)._M_string_length;
        *(ulong *)&local_78->ID = *(ulong *)&local_78->ID | (ulong)local_68;
        (local_78->cmd_str)._M_string_length = 0;
        *(bool *)&(local_78->cmd_str)._M_dataplus._M_p = SUB41(uVar7,0);
        (local_78->help)._M_string_length = 0;
      }
      if (local_58 == (undefined1  [8])&part._M_string_length) {
        return (command_node *)local_78;
      }
      operator_delete((void *)local_58,part._M_string_length + 1);
      return (command_node *)local_78;
    }
    pdVar8 = debug::initialize(0);
    dVar5 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    pcVar9 = local_60;
    pcVar11 = local_68;
    fVar19 = local_88;
    if ((((command_node *)word)->part)._M_string_length <= uVar15) {
LAB_0010aae4:
      uVar12 = std::__throw_out_of_range_fmt
                         ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                          SUB84(dVar5,0),uVar15);
      if ((command_node *)local_b0._0_8_ != (command_node *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if (local_58 != (undefined1  [8])&part._M_string_length) {
        operator_delete((void *)local_58,part._M_string_length + 1);
      }
      _Unwind_Resume(uVar12);
    }
    cVar1 = (((command_node *)word)->part)._M_dataplus._M_p[uVar15];
    uVar2 = (parent->name)._M_string_length;
    uVar18 = fVar14 - fVar17;
    word = &local_60->part;
    if (uVar18 == 0) {
      if (uVar2 == 0) {
        uVar15 = 0;
        goto LAB_0010aae4;
      }
      if (*(parent->name)._M_dataplus._M_p == cVar1) {
        uVar15 = uVar15 + 1;
        fVar14 = fVar14 + 1;
        goto LAB_0010a59f;
      }
      pcVar13 = (command *)(parent->help)._M_dataplus._M_p;
      bVar6 = true;
      if (pcVar13 == (command *)0x0) {
        pcVar11 = (command_node *)local_58;
        std::__cxx11::string::substr((ulong)pcVar11,(ulong)local_60);
        local_78 = (command *)
                   add_node(pcVar11,(command_node *)local_70,(string *)local_58,(filter_t)local_68,
                            (bool)part.field_2._M_local_buf[0xc]);
        if (local_58 != (undefined1  [8])&part._M_string_length) {
          operator_delete((void *)local_58,part._M_string_length + 1);
        }
        goto LAB_0010a803;
      }
    }
    else {
      if (uVar18 < uVar2) {
        if ((parent->name)._M_dataplus._M_p[uVar18] == cVar1) {
          uVar15 = uVar15 + 1;
          fVar14 = fVar14 + 1;
LAB_0010a59f:
          bVar6 = true;
          parent = local_80;
          goto LAB_0010a806;
        }
        local_90 = fVar14;
        pdVar8 = debug::initialize(0);
        dVar5 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        local_58 = (undefined1  [8])&part._M_string_length;
        pcVar3 = (parent->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  (SUB84(dVar5,0),local_58,pcVar3,pcVar3 + (parent->name)._M_string_length);
        pcVar9 = (command_node *)operator_new(0x58);
        command_node(pcVar9);
        std::__cxx11::string::assign((string *)pcVar9,(ulong)local_58,0);
        pcVar9->mask = *(ulong *)&parent->ID | (ulong)local_68;
        pcVar9->next = (command_node *)(parent->help)._M_dataplus._M_p;
        std::__cxx11::string::substr((ulong)local_b0,(ulong)local_58);
        std::__cxx11::string::operator=((string *)parent,(string *)local_b0);
        pcVar11 = (command_node *)local_b0._0_8_;
        if ((command_node *)local_b0._0_8_ != (command_node *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        (parent->help)._M_dataplus._M_p = (pointer)0x0;
        add_node(pcVar11,pcVar9,(command_node *)parent);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_80->help;
        if (local_80 == (command *)0x0) {
          paVar10 = &(local_70->cmd_str).field_2;
        }
        *(command_node **)paVar10 = pcVar9;
        if (pcVar9->next == (command_node *)0x0) {
          *(command_node **)((long)&(local_70->cmd_str).field_2 + 8) = pcVar9;
        }
        pcVar11 = (command_node *)local_b0;
        std::__cxx11::string::substr((ulong)local_b0,(ulong)local_60);
        fVar19 = local_88;
        local_78 = (command *)
                   add_node(pcVar11,pcVar9,(string *)local_b0,(filter_t)local_68,
                            (bool)part.field_2._M_local_buf[0xc]);
        pcVar9 = local_60;
        if ((command_node *)local_b0._0_8_ != (command_node *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        fVar14 = local_90;
        if (local_58 != (undefined1  [8])&part._M_string_length) {
          operator_delete((void *)local_58,part._M_string_length + 1);
          fVar14 = local_90;
        }
      }
      else {
        pcVar13 = *(command **)&(parent->cmd_str).field_2;
        *(ulong *)&parent->ID = *(ulong *)&parent->ID | (ulong)local_68;
        if (pcVar13 != (command *)0x0) {
          local_80 = (command *)0x0;
          local_88 = fVar14;
          local_70 = parent;
          goto LAB_0010a59f;
        }
        pcVar9 = (command_node *)local_58;
        std::__cxx11::string::substr((ulong)local_58,(ulong)local_60);
        local_78 = (command *)
                   add_node(pcVar9,(command_node *)parent,(string *)local_58,(filter_t)pcVar11,
                            (bool)part.field_2._M_local_buf[0xc]);
        fVar19 = local_88;
        pcVar9 = local_60;
        if (local_58 != (undefined1  [8])&part._M_string_length) {
          operator_delete((void *)local_58,part._M_string_length + 1);
          pcVar9 = local_60;
        }
      }
LAB_0010a803:
      bVar6 = false;
      pcVar13 = parent;
      local_88 = fVar19;
      word = &pcVar9->part;
      parent = local_80;
    }
LAB_0010a806:
    local_80 = parent;
    parent = pcVar13;
    fVar17 = local_88;
    if (!bVar6) {
      return (command_node *)local_78;
    }
  } while( true );
}

Assistant:

command_node *command_node::add(const std::string &word, command::filter_t mask_, bool hidden_)
    {
        LC_LOG_VERBOSE("+word[%s] mask[0x%08x] hidden[%s]",word.c_str(),mask_,hidden_?"true":"false");

        mask |= mask_; // always update root mask

        if (head == NULL) {
            // no need to search; just add whole word
            LC_LOG_VERBOSE("add-new-root");
            return add_node(this,word,mask_,hidden_);
        }
        else {
            size_t ti = 0; // tree index (cumulative)
            size_t wi = 0; // index of first character in partial word (wi <= ti)
            size_t si = 0; // index into search word (0..length)

            command_node *root = this;
            command_node *prev = NULL;
            command_node *n = head;

            while (n != NULL && si < word.length()) {
                LC_LOG_VERBOSE("root[%p] prev[%p] n[%p] ti[%zu] wi[%zu] si[%zu]",root,prev,n,ti,wi,si);
                char c = word.at(si);
                size_t ri = (ti - wi); // index relative to partial dictionary word
                if (ri == 0) {
                    // check for match in first letter, else go to next command_node
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else if (n->next == NULL) {
                        return add_node(root,word.substr(si),mask_,hidden_);
                    }
                    else {
                        prev = n;
                        n = n->next;
                    }
                }
                else if (ri < n->part.length()) {
                    // check for match in current part
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else {
                        // mismatch = split + add new part
                        LC_LOG_VERBOSE("mismatch->split");
                        std::string part = n->part;
                        command_node *nn = new command_node;
                        nn->part.assign(part,0,ri);
                        nn->mask = n->mask | mask_;
                        nn->next = n->next;
                        n->part.assign(part.substr(ri));
                        n->next = NULL;
                        // split = move existing command_node down one level
                        add_node(nn,n);
                        if (prev == NULL) {
                            root->head = nn;
                        }
                        else {
                            prev->next = nn;
                        }
                        if (nn->next == NULL) {
                            root->tail = nn;
                        }
                        return add_node(nn,word.substr(si),mask_,hidden_);
                    }
                }
                else {
                    // reached end of current part; go down one level if possible
                    if (n->head == NULL) {
                        n->mask |= mask_;
                        return add_node(n,word.substr(si),mask_,hidden_);
                    }
                    else {
                        wi = ti;
                        root = n;
                        root->mask |= mask_;
                        prev = NULL;
                        n = n->head;
                    }
                }
            }

            LC_LOG_VERBOSE("END1: root[%p] prev[%p] n[%p] ti[%zu] si[%zu] word.length[%zu]",root,prev,n,ti,si,word.length());

            if (n == NULL) 
                n = root;

            LC_LOG_VERBOSE("END2: n[%p] wi[%zu] part.length[%zu]",n,wi,n->part.length());

            if (si < word.length()) {
                // not found --> add rest of word
                n->mask |= mask_;
                return add_node(n,word.substr(si),mask_,hidden_);
            }
            else if (si < (wi + n->part.length())) {
                // found, but only partially --> split + add new part
                LC_LOG_VERBOSE("found(partially)->split");
                size_t ri = (si - wi); // index relative to partial dictionary word
                std::string part = n->part;
                n->part.assign(part,0,ri);
                command_node *head__ = n->head;
                command_node *tail__ = n->tail;
                // move command node content to new node
                n->head = n->tail = NULL;
                command_node *nn = add_node(n,part.substr(ri),n->mask,n->hidden);
                nn->cmd = n->cmd;
                nn->head = head__;
                nn->tail = tail__;
                nn->start = n->start;
                // clean up current node
                n->mask |= mask_;
                n->cmd = NULL;
                n->hidden = hidden_;
                n->start = NULL;
            }
            else {
                // duplicate
                LC_LOG_VERBOSE("duplicate node");
                n->mask |= mask_;
            }

            return n;
        }
    }